

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MouseInputHandler_glfw.cpp
# Opt level: O2

void anon_unknown.dwarf_13c97::_internalMouseButtonPressedCallback
               (GLFWwindow *window,int button,int action,int mods)

{
  int iVar1;
  void *pvVar2;
  __shared_ptr<InputHandler,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_> local_70;
  undefined1 local_58 [8];
  shared_ptr<InputHandler> handler;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  int local_34;
  
  local_34 = action;
  pvVar2 = glfwGetWindowUserPointer(window);
  std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>::
  vector(&local_70,
         (vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_> *)
         ((long)pvVar2 + 0x38));
  for (p_Var3 = &(local_70.
                  super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<InputHandler,_(__gnu_cxx::_Lock_policy)2>;
      p_Var3 != &(local_70.
                  super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<InputHandler,_(__gnu_cxx::_Lock_policy)2>; p_Var3 = p_Var3 + 1)
  {
    std::__shared_ptr<InputHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<InputHandler,_(__gnu_cxx::_Lock_policy)2> *)local_58,p_Var3);
    iVar1 = (***(_func_int ***)local_58)();
    if (iVar1 == 2) {
      std::dynamic_pointer_cast<MouseInputHandler,InputHandler>
                ((shared_ptr<InputHandler> *)
                 &handler.super___shared_ptr<InputHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      MouseInputHandler::mouseButtonPressed
                ((MouseInputHandler *)
                 handler.super___shared_ptr<InputHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi,button,local_34,mods);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&handler);
  }
  std::vector<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>::
  ~vector(&local_70);
  return;
}

Assistant:

void _internalMouseButtonPressedCallback(GLFWwindow* window, int button, int action, int mods) {
        Application* app = (Application*)glfwGetWindowUserPointer(window);
        for (auto handler : app->inputHandlers()) {
            if (handler->type() == InputType::Mouse) {
                std::dynamic_pointer_cast<MouseInputHandler>(handler)->mouseButtonPressed(button, action, mods);
            }
        }
    }